

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.c
# Opt level: O0

int compare_x_pos(void *p,void *q)

{
  undefined1 local_2c;
  undefined1 uStack_2b;
  undefined1 uStack_25;
  Sprite_Attribute b;
  Sprite_Attribute a;
  void *q_local;
  void *p_local;
  
  uStack_25 = (byte)((uint)*p >> 8);
  uStack_2b = (byte)((uint)*q >> 8);
  if (uStack_25 < uStack_2b) {
    p_local._4_4_ = -1;
  }
  else {
    local_2c = (byte)*q;
    if (local_2c < uStack_25) {
      p_local._4_4_ = 1;
    }
    else if (*(ushort *)((long)p + 4) < *(ushort *)((long)q + 4)) {
      p_local._4_4_ = -1;
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int compare_x_pos(const void* p, const void* q) {

    Sprite_Attribute a = *(const Sprite_Attribute*) p;
    Sprite_Attribute b = *(const Sprite_Attribute*) q;
    
    if(a.x_pos < b.x_pos) {
        return -1;
    } else if (a.x_pos > b.y_pos) {
        return 1;
    }

    if(a.oam_address < b.oam_address) {
        return -1;
    } 
    
    return 1;
}